

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDValidator.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DTDValidator::validateAttrValue
          (DTDValidator *this,XMLAttDef *attDef,XMLCh *attrValue,bool preValidation,
          XMLElementDecl *param_4)

{
  short *psVar1;
  bool bVar2;
  XMLCh XVar3;
  AttTypes AVar4;
  DefAttTypes DVar5;
  MemoryManager *pMVar6;
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  XMLCh *pXVar9;
  undefined4 extraout_var_00;
  XMLCh *pXVar10;
  long lVar11;
  ulong uVar12;
  DTDEntityDecl *pDVar13;
  XMLRefInfo *valueToAdopt;
  XMLCh *pXVar14;
  undefined4 extraout_var_03;
  byte bVar15;
  undefined8 *puVar16;
  size_t sVar17;
  XMLCh XVar18;
  Codes toEmit;
  bool bVar19;
  ArrayJanitor<char16_t> janTmpVal;
  XMLCh tempBuffer [100];
  ArrayJanitor<char16_t> local_120;
  MemoryManager *local_110;
  _func_int **local_108;
  XMLCh *local_100;
  XMLCh local_f8 [100];
  XMLCh *text1;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  AVar4 = attDef->fType;
  DVar5 = attDef->fDefaultType;
  pXVar10 = attDef->fValue;
  iVar8 = (*(attDef->super_XSerializable)._vptr_XSerializable[5])(attDef);
  text1 = (XMLCh *)CONCAT44(extraout_var,iVar8);
  local_100 = attDef->fEnumeration;
  bVar2 = attDef->fExternalAttribute;
  if (pXVar10 == attrValue || (DVar5 != Fixed || preValidation)) goto LAB_0030f1cc;
  pXVar9 = pXVar10;
  pXVar14 = attrValue;
  if (pXVar10 == (XMLCh *)0x0 || attrValue == (XMLCh *)0x0) {
    if (attrValue == (XMLCh *)0x0) {
      if (pXVar10 == (XMLCh *)0x0) goto LAB_0030f1cc;
LAB_0030f1a6:
      bVar19 = *pXVar9 == L'\0';
    }
    else {
      bVar19 = *attrValue == L'\0';
      if (bVar19 && pXVar10 != (XMLCh *)0x0) goto LAB_0030f1a6;
    }
    if (bVar19) goto LAB_0030f1cc;
  }
  else {
    do {
      XVar18 = *pXVar14;
      if (XVar18 == L'\0') goto LAB_0030f1a6;
      XVar3 = *pXVar9;
      pXVar9 = pXVar9 + 1;
      pXVar14 = pXVar14 + 1;
    } while (XVar18 == XVar3);
  }
  XMLValidator::emitError
            (&this->super_XMLValidator,NotSameAsFixedValue,text1,attrValue,pXVar10,(XMLCh *)0x0);
LAB_0030f1cc:
  if (AVar4 != AttTypes_Min) {
    if (*attrValue == L'\0') {
      XMLValidator::emitError
                (&this->super_XMLValidator,InvalidEmptyAttValue,text1,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
      return;
    }
    bVar15 = (byte)(0x3a8 >> ((byte)AVar4 & 0x1f)) & (uint)AVar4 < 10;
    uVar12 = 0;
    ArrayJanitor<char16_t>::ArrayJanitor(&local_120,(char16_t *)0x0);
    do {
      psVar1 = (short *)((long)attrValue + uVar12);
      uVar12 = uVar12 + 2;
    } while (*psVar1 != 0);
    if (uVar12 < 0xca) {
      pXVar10 = local_f8;
      XMLString::copyString(pXVar10,attrValue);
    }
    else {
      pMVar6 = ((this->super_XMLValidator).fScanner)->fMemoryManager;
      sVar17 = 0;
      do {
        psVar1 = (short *)((long)attrValue + sVar17);
        sVar17 = sVar17 + 2;
      } while (*psVar1 != 0);
      iVar8 = (*pMVar6->_vptr_MemoryManager[3])(pMVar6,sVar17);
      memcpy((char16_t *)CONCAT44(extraout_var_00,iVar8),attrValue,sVar17);
      ArrayJanitor<char16_t>::reset
                (&local_120,(char16_t *)CONCAT44(extraout_var_00,iVar8),
                 ((this->super_XMLValidator).fScanner)->fMemoryManager);
      pXVar10 = ArrayJanitor<char16_t>::get(&local_120);
    }
    if ((bVar15 != 0) &&
       ((bVar2 == false || (((this->super_XMLValidator).fScanner)->fStandalone == false)))) {
      XMLString::collapseWS(pXVar10,((this->super_XMLValidator).fScanner)->fMemoryManager);
    }
    bVar2 = ((this->super_XMLValidator).fScanner)->fDoNamespaces;
    bVar19 = false;
    local_108 = (_func_int **)&PTR__XMLRefInfo_00414c50;
    do {
      if (((uint)AVar4 < 6) || (pXVar9 = pXVar10, AVar4 == Notation)) {
        if ((((this->super_XMLValidator).fReaderMgr)->fCurReader->fgCharCharsTable[(ushort)*pXVar10]
            & 2) == 0) {
          XMLValidator::emitError
                    (&this->super_XMLValidator,AttrValNotName,pXVar10,text1,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
        pXVar9 = pXVar10 + 1;
      }
      for (; XVar18 = *pXVar9, XVar18 != L'\0'; pXVar9 = pXVar9 + 1) {
        if (XVar18 == L' ') {
          if (bVar15 == 0) {
            XMLValidator::emitError
                      (&this->super_XMLValidator,NoMultipleValues,text1,(XMLCh *)0x0,(XMLCh *)0x0,
                       (XMLCh *)0x0);
            goto LAB_0030f671;
          }
          break;
        }
        if (((XVar18 == L':') && (bVar2 != false)) && (((uint)AVar4 < 6 || (AVar4 == Notation)))) {
          XMLValidator::emitError(&this->super_XMLValidator,ColonNotValidWithNS);
        }
        if ((((this->super_XMLValidator).fReaderMgr)->fCurReader->fgCharCharsTable[(ushort)*pXVar9]
            & 4) == 0) {
          XMLValidator::emitError
                    (&this->super_XMLValidator,AttrValNotName,pXVar9,text1,(XMLCh *)0x0,(XMLCh *)0x0
                    );
          goto LAB_0030f671;
        }
      }
      if (XVar18 == L'\0') {
        bVar19 = true;
      }
      *pXVar9 = L'\0';
      if ((uint)AVar4 < 4) {
        iVar8 = (*((this->super_XMLValidator).fScanner)->fValidationContext->_vptr_ValidationContext
                  [2])();
        lVar11 = CONCAT44(extraout_var_01,iVar8);
        if ((pXVar10 == (XMLCh *)0x0) || (uVar12 = (ulong)(ushort)*pXVar10, uVar12 == 0)) {
          uVar12 = 0;
        }
        else {
          XVar18 = pXVar10[1];
          if (XVar18 != L'\0') {
            pXVar14 = pXVar10 + 2;
            do {
              uVar12 = (ulong)(ushort)XVar18 + (uVar12 >> 0x18) + uVar12 * 0x26;
              XVar18 = *pXVar14;
              pXVar14 = pXVar14 + 1;
            } while (XVar18 != L'\0');
          }
          uVar12 = uVar12 % *(ulong *)(lVar11 + 0x18);
        }
        puVar16 = *(undefined8 **)(*(long *)(lVar11 + 0x10) + uVar12 * 8);
        if (puVar16 != (undefined8 *)0x0) {
          do {
            bVar7 = StringHasher::equals((StringHasher *)(lVar11 + 0x30),pXVar10,(void *)puVar16[2])
            ;
            if (bVar7) goto LAB_0030f533;
            puVar16 = (undefined8 *)puVar16[1];
          } while (puVar16 != (undefined8 *)0x0);
        }
        puVar16 = (undefined8 *)0x0;
LAB_0030f533:
        if (puVar16 == (undefined8 *)0x0) {
          valueToAdopt = (XMLRefInfo *)0x0;
        }
        else {
          valueToAdopt = (XMLRefInfo *)*puVar16;
        }
        if (valueToAdopt == (XMLRefInfo *)0x0) {
          local_110 = ((this->super_XMLValidator).fScanner)->fMemoryManager;
          valueToAdopt = (XMLRefInfo *)XMemory::operator_new(0x20,local_110);
          pMVar6 = ((this->super_XMLValidator).fScanner)->fMemoryManager;
          (valueToAdopt->super_XSerializable)._vptr_XSerializable = local_108;
          valueToAdopt->fDeclared = false;
          valueToAdopt->fUsed = false;
          valueToAdopt->fRefName = (XMLCh *)0x0;
          valueToAdopt->fMemoryManager = pMVar6;
          if (pXVar10 == (XMLCh *)0x0) {
            pXVar14 = (XMLCh *)0x0;
          }
          else {
            sVar17 = 0;
            do {
              psVar1 = (short *)((long)pXVar10 + sVar17);
              sVar17 = sVar17 + 2;
            } while (*psVar1 != 0);
            iVar8 = (*pMVar6->_vptr_MemoryManager[3])(pMVar6,sVar17);
            pXVar14 = (XMLCh *)CONCAT44(extraout_var_02,iVar8);
            memcpy(pXVar14,pXVar10,sVar17);
          }
          valueToAdopt->fRefName = pXVar14;
          iVar8 = (*((this->super_XMLValidator).fScanner)->fValidationContext->
                    _vptr_ValidationContext[2])();
          RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::put
                    ((RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *)
                     CONCAT44(extraout_var_03,iVar8),valueToAdopt->fRefName,valueToAdopt);
        }
        else if ((AVar4 == ID) && (valueToAdopt->fDeclared != false)) {
          XMLValidator::emitError
                    (&this->super_XMLValidator,ReusedIDValue,pXVar10,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
        if (AVar4 == ID) {
          valueToAdopt->fDeclared = true;
        }
        else if (!preValidation) {
          valueToAdopt->fUsed = true;
        }
      }
      else if ((AVar4 & ~ID) == Entity && !preValidation) {
        pDVar13 = DTDGrammar::getEntityDecl(this->fDTDGrammar,pXVar10);
        if (pDVar13 == (DTDEntityDecl *)0x0) {
          toEmit = UnknownEntityRefAttr;
          pXVar14 = text1;
        }
        else {
          if ((pDVar13->super_XMLEntityDecl).fNotationName != (XMLCh *)0x0) goto LAB_0030f63d;
          toEmit = BadEntityRefAttr;
          pXVar14 = pXVar10;
          pXVar10 = text1;
        }
        XMLValidator::emitError
                  (&this->super_XMLValidator,toEmit,pXVar14,pXVar10,(XMLCh *)0x0,(XMLCh *)0x0);
      }
      else if (((AVar4 & ~ID) == Notation) &&
              (bVar7 = XMLString::isInList(pXVar10,local_100), !bVar7)) {
        XMLValidator::emitError
                  (&this->super_XMLValidator,DoesNotMatchEnumList,pXVar10,text1,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
LAB_0030f63d:
    } while ((bVar15 != 0) && (pXVar10 = pXVar9 + 1, !bVar19));
LAB_0030f671:
    ArrayJanitor<char16_t>::~ArrayJanitor(&local_120);
  }
  return;
}

Assistant:

void
DTDValidator::validateAttrValue(const   XMLAttDef*      attDef
                                , const XMLCh* const    attrValue
                                , bool                  preValidation
                                , const XMLElementDecl*)
{
    //
    //  Get quick refs to lost of of the stuff in the passed objects in
    //  order to simplify the code below, which will reference them very
    //  often.
    //
    const XMLAttDef::AttTypes       type = attDef->getType();
    const XMLAttDef::DefAttTypes    defType = attDef->getDefaultType();
    const XMLCh* const              valueText = attDef->getValue();
    const XMLCh* const              fullName = attDef->getFullName();
    const XMLCh* const              enumList = attDef->getEnumeration();
    const bool                      isExternal = attDef->isExternal();

    //
    //  If the default type is fixed, then make sure the passed value maps
    //  to the fixed value.
    //  If during preContentValidation, the value we are validating is the fixed value itself
    //  so no need to compare.
    //  Only need to do this for regular attribute value validation
    //
    if (defType == XMLAttDef::Fixed && !preValidation)
    {
        if (!XMLString::equals(attrValue, valueText))
            emitError(XMLValid::NotSameAsFixedValue, fullName, attrValue, valueText);
    }

    //
    //  If its a CDATA attribute, then we are done with any DTD level
    //  validation else do the rest.
    //
    if (type == XMLAttDef::CData)
        return;



    // An empty string cannot be valid for any of the other types
    if (!attrValue[0])
    {
        emitError(XMLValid::InvalidEmptyAttValue, fullName);
        return;
    }

    // See whether we are doing multiple values or not
    const bool multipleValues =
    (
        (type == XMLAttDef::IDRefs)
        || (type == XMLAttDef::Entities)
        || (type == XMLAttDef::NmTokens)
        || (type == XMLAttDef::Notation)
        || (type == XMLAttDef::Enumeration)
    );

    // And whether we must check for a first name char
    const bool firstNameChar =
    (
        (type == XMLAttDef::ID)
        || (type == XMLAttDef::IDRef)
        || (type == XMLAttDef::IDRefs)
        || (type == XMLAttDef::Entity)
        || (type == XMLAttDef::Entities)
        || (type == XMLAttDef::Notation)
    );

    // Whether it requires ref checking stuff
    const bool isARefType
    (
        (type == XMLAttDef::ID)
        || (type == XMLAttDef::IDRef)
        || (type == XMLAttDef::IDRefs)
    );

    // Some trigger flags to avoid issuing redundant errors and whatnot    
    bool alreadyCapped = false;

    //
    //  Make a copy of the text that we can mangle and get a pointer we can
    //  move through the value
    //

    // Use a stack-based buffer, when possible...
    XMLCh   tempBuffer[100];

    XMLCh* pszTmpVal = 0;

    ArrayJanitor<XMLCh> janTmpVal(0);

    if (XMLString::stringLen(attrValue) < sizeof(tempBuffer) / sizeof(tempBuffer[0]))
    {
        XMLString::copyString(tempBuffer, attrValue);
        pszTmpVal = tempBuffer;
    }
    else
    {
        janTmpVal.reset(XMLString::replicate(attrValue, getScanner()->getMemoryManager()), getScanner()->getMemoryManager());
        pszTmpVal = janTmpVal.get();
    }

    //  if the type is an enumeration, normalize it, unless standalone = yes is specified
    //  "The standalone document declaration MUST have the value "no" if any external markup declarations contain declarations of:
    //   - ...
    //   - attributes with tokenized types, where the attribute appears in the document with a value such that normalization will 
    //     produce a different value from that which would be produced in the absence of the declaration"
    if (multipleValues && (!isExternal || !getScanner()->getStandalone()))
        XMLString::collapseWS(pszTmpVal, getScanner()->getMemoryManager());

    XMLCh* valPtr = pszTmpVal;

    bool doNamespace = getScanner()->getDoNamespaces();

    while (true)
    {
        //
        //  Make sure the first character is a valid first name char, i.e.
        //  if its a Name value. For NmToken values we don't treat the first
        //  char any differently.
        //
        if (firstNameChar)
        {
            // If its not, emit and error but try to keep going
            if (!getReaderMgr()->getCurrentReader()->isFirstNameChar(*valPtr))
                emitError(XMLValid::AttrValNotName, valPtr, fullName);
            valPtr++;
        }

        // Make sure all the remaining chars are valid name chars
        while (*valPtr)
        {
            //
            //  If we hit a whitespace, its either a break between two
            //  or more values, or an error if we have a single value.
            //
            //
            //   XML1.0-3rd
            //
            //   [6]   Names   ::=   Name (#x20 Name)*
            //   [8]   Nmtokens   ::=   Nmtoken (#x20 Nmtoken)*
            //
            //   only and only ONE #x20 is allowed to be the delimiter
            //
            if (*valPtr==chSpace)
            {
                if (!multipleValues)
                {
                    emitError(XMLValid::NoMultipleValues, fullName);
                    return;
                }

                break;
            }

            // Now this attribute can be of type
            //     ID, IDREF, IDREFS, ENTITY, ENTITIES, NOTATION, NMTOKEN, NMTOKENS, ENUMERATION
            //  All these must be valid XMLName
            // If namespace is enabled, colon is not allowed in the first 6

            if (doNamespace && *valPtr == chColon && firstNameChar)
                emitError(XMLValid::ColonNotValidWithNS);

            if (!getReaderMgr()->getCurrentReader()->isNameChar(*valPtr))
            {
                emitError(XMLValid::AttrValNotName, valPtr, fullName);
                return;
            }
            valPtr++;
        }

        //
        //  Cap it off at the current non-name char. If already capped,
        //  then remember this.
        //
        if (!(*valPtr))
            alreadyCapped = true;
        *valPtr = 0;

        //
        //  If this type of attribute requires that we track reference
        //  stuff, then handle that.
        //
        if (isARefType)
        {
            if ((type == XMLAttDef::ID)
            ||  (type == XMLAttDef::IDRef)
            ||  (type == XMLAttDef::IDRefs))
            {
                XMLRefInfo* find = getScanner()->getIDRefList()->get(pszTmpVal);
                if (find)
                {
                    if (find->getDeclared() && (type == XMLAttDef::ID))
                        emitError(XMLValid::ReusedIDValue, pszTmpVal);
                }
                 else
                {
                    find = new (getScanner()->getMemoryManager()) XMLRefInfo
                    (
                        pszTmpVal
                        , false
                        , false
                        , getScanner()->getMemoryManager()
                    );
                    getScanner()->getIDRefList()->put((void*)find->getRefName(), find);
                }

                //
                //  Mark it declared or used, which might be redundant in some cases
                //  but not worth checking
                //
                if (type == XMLAttDef::ID)
                    find->setDeclared(true);
                else {
                    if (!preValidation) {
                        find->setUsed(true);
                    }
                }
            }
        }
         else if (!preValidation && ((type == XMLAttDef::Entity) || (type == XMLAttDef::Entities)))
        {
            //
            //  If its refering to a entity, then look up the name in the
            //  general entity pool. If not there, then its an error. If its
            //  not an external unparsed entity, then its an error.
            //
            //  In case of pre-validation, the above errors should be ignored.
            //
            const XMLEntityDecl* decl = fDTDGrammar->getEntityDecl(pszTmpVal);
            if (decl)
            {
                if (!decl->isUnparsed())
                    emitError(XMLValid::BadEntityRefAttr, pszTmpVal, fullName);
            }
             else
            {
                emitError
                (
                    XMLValid::UnknownEntityRefAttr
                    , fullName
                    , pszTmpVal
                );
            }
        }
         else if ((type == XMLAttDef::Notation) || (type == XMLAttDef::Enumeration))
        {
            //
            //  Make sure that this value maps to one of the enumeration or
            //  notation values in the enumList parameter. We don't have to
            //  look it up in the notation pool (if a notation) because we
            //  will look up the enumerated values themselves. If they are in
            //  the notation pool (after the DTD is parsed), then obviously
            //  this value will be legal since it matches one of them.
            //
            if (!XMLString::isInList(pszTmpVal, enumList))
                emitError(XMLValid::DoesNotMatchEnumList, pszTmpVal, fullName);
        }

        // If not doing multiple values, then we are done
        if (!multipleValues)
            break;

        //
        //  If we are at the end, then break out now, else move up to the
        //  next char and update the base pointer.
        //
        if (alreadyCapped)
            break;

        valPtr++;
        pszTmpVal = valPtr;
    }

}